

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeAsyncFromSyncIteratorPrototype
               (DynamicObject *asyncFromSyncIteratorProtototype,DeferredTypeHandlerBase *typeHandler
               ,DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  code *pcVar1;
  bool bVar2;
  undefined8 in_RAX;
  undefined4 *puVar3;
  JavascriptFunction *pJVar4;
  uint uVar6;
  ulong uVar5;
  
  uVar6 = (uint)((ulong)in_RAX >> 0x20);
  this = (((asyncFromSyncIteratorProtototype->super_RecyclableObject).type.ptr)->javascriptLibrary).
         ptr;
  if (((((this->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->
      m_ES2018AsyncIteration == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0xb9e,
                                "(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled())"
                                ,
                                "library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  DeferredTypeHandlerBase::Convert(typeHandler,asyncFromSyncIteratorProtototype,mode,3,0);
  pJVar4 = EnsureAsyncFromSyncIteratorReturnFunction(this);
  uVar5 = (ulong)uVar6 << 0x20;
  (*(asyncFromSyncIteratorProtototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (asyncFromSyncIteratorProtototype,0x135,pJVar4,6,0,0,uVar5);
  pJVar4 = EnsureAsyncFromSyncIteratorNextFunction(this);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(asyncFromSyncIteratorProtototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (asyncFromSyncIteratorProtototype,0x107,pJVar4,6,0,0,uVar5);
  pJVar4 = EnsureAsyncFromSyncIteratorThrowFunction(this);
  (*(asyncFromSyncIteratorProtototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (asyncFromSyncIteratorProtototype,0x16a,pJVar4,6,0,0,uVar5 & 0xffffffff00000000);
  DynamicObject::SetHasNoEnumerableProperties(asyncFromSyncIteratorProtototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeAsyncFromSyncIteratorPrototype(DynamicObject* asyncFromSyncIteratorProtototype, DeferredTypeHandlerBase* typeHandler, DeferredInitializeMode mode)
    {
        JavascriptLibrary* library = asyncFromSyncIteratorProtototype->GetLibrary();
        Assert(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled());
        typeHandler->Convert(asyncFromSyncIteratorProtototype, mode, 3);
        // note per spec this also has a toStringTag but it is not observable at runtime so omitted

        library->AddMember(asyncFromSyncIteratorProtototype, PropertyIds::return_, library->EnsureAsyncFromSyncIteratorReturnFunction(), PropertyBuiltInMethodDefaults);
        library->AddMember(asyncFromSyncIteratorProtototype, PropertyIds::next, library->EnsureAsyncFromSyncIteratorNextFunction(), PropertyBuiltInMethodDefaults);
        library->AddMember(asyncFromSyncIteratorProtototype, PropertyIds::throw_, library->EnsureAsyncFromSyncIteratorThrowFunction(), PropertyBuiltInMethodDefaults);

        asyncFromSyncIteratorProtototype->SetHasNoEnumerableProperties(true);

        return true;
    }